

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_audio.cpp
# Opt level: O1

void __thiscall synth_state::run<short>(synth_state *this,short *audiobuffer,long nframes)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  
  if (0 < this->num_channels) {
    lVar2 = 0;
    do {
      lVar3 = lVar2 + 1;
      if (0 < nframes) {
        fVar1 = this->sample_rate;
        lVar4 = 0;
        do {
          fVar5 = sinf(this->phase[lVar2]);
          audiobuffer[lVar2 + this->num_channels * lVar4] = (short)(int)(fVar5 * 0.2 * 32767.0);
          this->phase[lVar2] = this->phase[lVar2] + ((float)(int)lVar3 * 220.0 * 6.2831855) / fVar1;
          lVar4 = lVar4 + 1;
        } while (nframes != lVar4);
      }
      lVar2 = lVar3;
    } while (lVar3 < this->num_channels);
  }
  return;
}

Assistant:

void run(T* audiobuffer, long nframes)
    {
      for(int c=0;c < num_channels;++c) {
        float freq = get_frequency(c);
        float phase_inc = 2.0 * M_PI * freq / sample_rate;
        for(long n=0;n < nframes;++n) {
          audiobuffer[n*num_channels+c] = ConvertSample<T>(sin(phase[c]) * VOLUME);
          phase[c] += phase_inc;
        }
      }
    }